

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O0

longlong __thiscall
ValueExtractor<long_long>::operator()(ValueExtractor<long_long> *this,longdouble param_2)

{
  runtime_error *this_00;
  char (*in_stack_00000008) [16];
  string local_38 [24];
  char **in_stack_ffffffffffffffe0;
  char (*format_str) [16];
  
  format_str = in_stack_00000008;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::type_info::name((type_info *)&long_double::typeinfo);
  fmt::v5::format<char[16],char_const*>(format_str,in_stack_ffffffffffffffe0);
  std::runtime_error::runtime_error(this_00,local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FMT_NORETURN T operator()(U) {
    throw std::runtime_error(fmt::format("invalid type {}", typeid(U).name()));
  }